

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O3

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::store
          (mem_cache<cppcms::impl::process_settings> *this,string *key,string *a,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *triggers_in,time_t timeout_in,uint64_t *gen)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>_11
  *paVar2;
  triggers_list_type *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>_11
  *paVar3;
  triggers_list_type *this_01;
  pointer pcVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  container *pcVar7;
  uint64_t uVar8;
  iterator iVar9;
  const_iterator cVar10;
  _Rb_tree_node_base *p_Var11;
  _Self __tmp;
  shared_mutex *this_03;
  pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::container_*,_bool>
  pVar12;
  pointer main;
  string_type tmp;
  string_type int_key;
  string_type ar;
  iterator local_1c8;
  shared_mutex *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>_11
  *local_1b8;
  uint64_t *local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1a8;
  value_type local_1a0;
  basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
  local_130;
  basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
  local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>
  local_f0;
  container local_80;
  
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  pcVar4 = (a->_M_dataplus)._M_p;
  paVar2 = &local_1a0.first.field_2;
  local_1b0 = gen;
  local_1a8 = &triggers_in->_M_t;
  local_1a0.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::
  basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>
  ::_M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>
              *)&local_1a0,pcVar4,pcVar4 + a->_M_string_length);
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
  ::swap(&local_110,&local_1a0.first);
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
  ::_M_dispose(&local_1a0.first);
  this_03 = (this->access_lock)._M_t.
            super___uniq_ptr_impl<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>
            ._M_t.
            super__Tuple_impl<0UL,_cppcms::impl::shared_mutex_*,_std::default_delete<cppcms::impl::shared_mutex>_>
            .super__Head_base<0UL,_cppcms::impl::shared_mutex_*,_false>._M_head_impl;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>_11
               *)timeout_in;
  shared_mutex::wrlock(this_03);
  local_1c8.p_ = (iterator)0x0;
  local_1c8.p_ = details::
                 basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>
                 ::find<std::__cxx11::string>
                           ((basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>
                             *)&this->primary,key);
  if (local_1c8.p_ != (iterator)0x0) {
    delete_node(this,(pointer)local_1c8.p_);
  }
  if (this->size <= *(ulong *)(process_settings::process_memory + 0x40) / 0x14) {
    check_limits(this);
    pcVar4 = (key->_M_dataplus)._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    local_1c0 = this_03;
    std::__cxx11::
    basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>
    ::_M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>
                *)&local_130,pcVar4,pcVar4 + key->_M_string_length);
    local_80.data._M_dataplus._M_p = (pointer)&local_80.data.field_2;
    local_80.generation = 0;
    local_80.data.field_2._M_allocated_capacity = 0;
    local_80.data.field_2._8_8_ = 0;
    local_80.data._M_string_length = 0;
    local_80.lru._M_node = (_List_node_base *)0x0;
    local_80.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)&local_80.triggers;
    local_80.triggers.super__List_base<_88767e2a_>._M_impl._M_node._M_size = 0;
    local_80.timeout._M_node = (_Base_ptr)0x0;
    local_80.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base._M_prev =
         local_80.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base.
         _M_next;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>_&,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_true>
              (&local_f0,&local_130,&local_80);
    paVar3 = &local_f0.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>_11
         *)local_f0.first._M_dataplus._M_p == paVar3) {
      local_1a0.first.field_2._8_8_ = local_f0.first.field_2._8_8_;
      local_1a0.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1a0.first._M_dataplus._M_p = local_f0.first._M_dataplus._M_p;
    }
    paVar2 = &local_f0.second.data.field_2;
    local_1a0.second.data._M_dataplus._M_p = (pointer)&local_1a0.second.data.field_2;
    local_1a0.first._M_string_length = local_f0.first._M_string_length;
    local_f0.first._M_string_length = 0;
    local_f0.first.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>_11
         *)local_f0.second.data._M_dataplus._M_p == paVar2) {
      local_1a0.second.data.field_2._8_8_ = local_f0.second.data.field_2._8_8_;
    }
    else {
      local_1a0.second.data._M_dataplus._M_p = local_f0.second.data._M_dataplus._M_p;
    }
    this_01 = &local_f0.second.triggers;
    this_00 = &local_1a0.second.triggers;
    local_1a0.second.data._M_string_length = local_f0.second.data._M_string_length;
    local_f0.second.data._M_string_length = 0;
    local_f0.second.data.field_2._M_local_buf[0] = '\0';
    local_1a0.second.lru._M_node = local_f0.second.lru._M_node;
    local_1a0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base.
    _M_next = local_f0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.
              super__List_node_base._M_next;
    local_1a0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base.
    _M_prev = local_f0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.
              super__List_node_base._M_prev;
    local_1a0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node._M_size =
         local_f0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node._M_size;
    p_Var5 = (_List_node_base *)this_00;
    p_Var6 = (_List_node_base *)this_00;
    if (local_f0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base.
        _M_next != (_List_node_base *)this_01) {
      (((_List_base<_88767e2a_> *)
       &(local_f0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base
        ._M_prev)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next =
           (_List_node_base *)this_00;
      (local_f0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base.
      _M_next)->_M_prev = (_List_node_base *)this_00;
      local_f0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node._M_size = 0;
      p_Var5 = local_1a0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.
               super__List_node_base._M_next;
      p_Var6 = local_1a0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.
               super__List_node_base._M_prev;
      local_f0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base.
      _M_next = (_List_node_base *)this_01;
      local_f0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base.
      _M_prev = (_List_node_base *)this_01;
    }
    local_1a0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base.
    _M_prev = p_Var6;
    local_1a0.second.triggers.super__List_base<_88767e2a_>._M_impl._M_node.super__List_node_base.
    _M_next = p_Var5;
    local_1a0.second.timeout._M_node = local_f0.second.timeout._M_node;
    local_1a0.second.generation = local_f0.second.generation;
    local_f0.first._M_dataplus._M_p = (pointer)paVar3;
    local_f0.second.data._M_dataplus._M_p = (pointer)paVar2;
    pVar12 = details::
             basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>
             ::insert(&(this->primary).impl_,&local_1a0);
    pcVar7 = pVar12.first;
    std::__cxx11::_List_base<$88767e2a$>::_M_clear(&this_00->super__List_base<_88767e2a_>);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
    ::_M_dispose(&local_1a0.second.data);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
    ::_M_dispose(&local_1a0.first);
    std::__cxx11::_List_base<$88767e2a$>::_M_clear(&this_01->super__List_base<_88767e2a_>);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
    ::_M_dispose(&local_f0.second.data);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
    ::_M_dispose(&local_f0.first);
    this_02 = local_1a8;
    this_03 = local_1c0;
    std::__cxx11::_List_base<$88767e2a$>::_M_clear(&local_80.triggers.super__List_base<_88767e2a_>);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
    ::_M_dispose(&local_80.data);
    this->size = this->size + 1;
    local_1c8.p_ = pcVar7;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
    ::swap(&(pcVar7->val).second.data,&local_110);
    if (local_1b0 == (uint64_t *)0x0) {
      uVar8 = this->generation;
      this->generation = uVar8 + 1;
    }
    else {
      uVar8 = *local_1b0;
    }
    (pcVar7->val).second.generation = uVar8;
    std::__cxx11::
    list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::process_settings::process_memory>>
    ::
    _M_insert<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator_const&>
              ((list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::process_settings::process_memory>>
                *)&this->lru,
               (this->lru).
               super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
               ._M_impl._M_node.super__List_node_base._M_next,&local_1c8);
    (pcVar7->val).second.lru._M_node =
         (this->lru).
         super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    local_1a0.first._M_dataplus._M_p = (pointer)local_1b8;
    local_1a0.first._M_string_length = (size_type)local_1c8.p_;
    iVar9 = std::
            _Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator>>,std::less<long>,cppcms::impl::shmem_allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator>,cppcms::impl::process_settings::process_memory>>
            ::
            _M_emplace_equal<std::pair<long,cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator>>
                      ((_Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator>>,std::less<long>,cppcms::impl::shmem_allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator>,cppcms::impl::process_settings::process_memory>>
                        *)&this->timeout,
                       (pair<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator>
                        *)&local_1a0);
    (pcVar7->val).second.timeout._M_node = iVar9._M_node;
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(this_02,key);
    p_Var1 = &(this_02->_M_impl).super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar10._M_node == p_Var1) {
      add_trigger(this,(pointer)local_1c8.p_,key);
    }
    for (p_Var11 = (this_02->_M_impl).super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var11 != p_Var1;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      add_trigger(this,(pointer)local_1c8.p_,(string *)(p_Var11 + 1));
    }
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
    ::_M_dispose(&local_130);
  }
  shared_mutex::unlock(this_03);
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
  ::_M_dispose(&local_110);
  return;
}

Assistant:

virtual void store(	std::string const &key,
				std::string const &a,
				std::set<std::string> const &triggers_in,
				time_t timeout_in,
				uint64_t const *gen)
	{
		string_type ar;
		try {
			string_type tmp = to_int(a);
			ar.swap(tmp);
		}
		catch(std::bad_alloc const &) {
			return;
		}

		wrlock_guard lock(*access_lock);
		try {
			pointer main;
			main=primary.find(key);
			if(main!=primary.end())
				delete_node(main);
			if(size > size_limit())
				return;
			check_limits();
			string_type int_key = to_int(key);

			std::pair<pointer,bool> res=primary.insert(std::pair<string_type,container>(int_key,container()));
			size ++;
			main=res.first;
			container &cont=main->second;
			cont.data.swap(ar);
			if(gen)
				cont.generation=*gen;
			else
				cont.generation=generation++;
			lru.push_front(main);
			cont.lru=lru.begin();
			cont.timeout=timeout.insert(std::pair<time_t,pointer>(timeout_in,main));
			if(triggers_in.find(key)==triggers_in.end()){
				add_trigger(main,key);
			}
			std::set<std::string>::const_iterator si;
			for(si=triggers_in.begin();si!=triggers_in.end();si++) {
				add_trigger(main,*si);
			}
		}
		catch(std::bad_alloc const &e)
		{
			nl_clear();
		}
	}